

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page-queue.c
# Opt level: O0

mi_page_queue_t * mi_heap_page_queue_of(mi_heap_t *heap,mi_page_t *page)

{
  size_t sVar1;
  mi_page_t *in_RSI;
  long in_RDI;
  mi_page_queue_t *pq;
  size_t bin;
  
  sVar1 = mi_page_bin(in_RSI);
  return (mi_page_queue_t *)(in_RDI + 0x500 + sVar1 * 0x18);
}

Assistant:

static mi_page_queue_t* mi_heap_page_queue_of(mi_heap_t* heap, const mi_page_t* page) {
  mi_assert_internal(heap!=NULL);
  const size_t bin = mi_page_bin(page);
  mi_page_queue_t* pq = &heap->pages[bin];
  mi_assert_internal((mi_page_block_size(page) == pq->block_size) ||
                       (mi_page_is_large_or_huge(page) && mi_page_queue_is_huge(pq)) ||
                         (mi_page_is_in_full(page) && mi_page_queue_is_full(pq)));
  return pq;
}